

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O3

void __thiscall Nova::Simplex_Mesh<3>::Initialize_Adjacent_Elements(Simplex_Mesh<3> *this)

{
  Array<Nova::Array<int>_> *pAVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  int i;
  int iVar5;
  int simplex;
  ulong uVar6;
  allocator_type local_51;
  Array<Nova::Array<int>_> *local_50;
  value_type local_48;
  
  pAVar1 = this->adjacent_elements;
  if (pAVar1 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar1->_data);
    operator_delete(pAVar1);
  }
  pAVar1 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::vector
            ((vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_> *)pAVar1,
             ((long)(this->elements)._data.
                    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->elements)._data.
                    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,&local_48,
             &local_51);
  this->adjacent_elements = pAVar1;
  if (local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_50 = this->incident_elements;
  if (local_50 == (Array<Nova::Array<int>_> *)0x0) {
    Initialize_Incident_Elements(this);
  }
  pVVar2 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->elements)._data.
                super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  if (lVar3 != 0) {
    uVar4 = (lVar3 >> 2) * -0x5555555555555555;
    uVar6 = 0;
    do {
      simplex = (int)uVar6;
      if (uVar4 <= (ulong)(long)simplex) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar5 = 0;
      do {
        Vector<int,_3,_true>::Remove_Index
                  ((Vector<int,_3,_true> *)&local_48,(int)pVVar2 + simplex * 0xc);
        Find_And_Append_Adjacent_Elements(this,simplex,(Vector<int,_2,_true> *)&local_48);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 3);
      uVar6 = uVar6 + 1;
      pVVar2 = (this->elements)._data.
               super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->elements)._data.
                     super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 2) *
              -0x5555555555555555;
    } while (uVar6 < uVar4);
  }
  if (local_50 == (Array<Nova::Array<int>_> *)0x0) {
    pAVar1 = this->incident_elements;
    if (pAVar1 != (Array<Nova::Array<int>_> *)0x0) {
      std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar1->_data);
    }
    operator_delete(pAVar1);
    this->incident_elements = (Array<Nova::Array<int>_> *)0x0;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Adjacent_Elements()
{
    if(adjacent_elements!=nullptr) delete adjacent_elements;
    adjacent_elements=new Array<Array<int>>(elements.size());
    
    bool incident_elements_defined=(incident_elements!=nullptr);
    if(!incident_elements_defined) Initialize_Incident_Elements();

    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) Find_And_Append_Adjacent_Elements(t,element.Remove_Index(i));}
    if(!incident_elements_defined){delete incident_elements;incident_elements=nullptr;}
}